

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfBuffer(Buffer *buffer,json *o)

{
  char cVar1;
  size_type number;
  long lVar2;
  allocator local_99;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  json *local_18;
  json *o_local;
  Buffer *buffer_local;
  
  local_18 = o;
  o_local = (json *)buffer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"byteLength",&local_39);
  number = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(o_local + 2));
  SerializeNumberProperty<unsigned_long>(&local_38,number,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  SerializeGltfBufferData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(o_local + 2),local_18);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"name",&local_71);
    SerializeStringProperty(&local_70,(string *)o_local,local_18);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  cVar1 = Value::Type((Value *)&o_local[5].m_value);
  if (cVar1 != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"extras",&local_99);
    SerializeValue(&local_98,(Value *)&o_local[5].m_value,local_18);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  return;
}

Assistant:

static void SerializeGltfBuffer(Buffer &buffer, json &o) {
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeGltfBufferData(buffer.data, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  if (buffer.extras.Type() != NULL_TYPE) {
    SerializeValue("extras", buffer.extras, o);
  }
}